

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_broadcast(lws_context_per_thread *pt,int reason,void *in,size_t len)

{
  int iVar1;
  lws_protocols *local_40;
  lws_protocols *p;
  int ret;
  int n;
  lws_vhost *v;
  size_t len_local;
  void *in_local;
  int reason_local;
  lws_context_per_thread *pt_local;
  
  _ret = pt->context->vhost_list;
  p._0_4_ = 0;
  pt->fake_wsi->context = pt->context;
  for (; _ret != (lws_vhost *)0x0; _ret = _ret->vhost_next) {
    local_40 = _ret->protocols;
    pt->fake_wsi->vhost = _ret;
    for (p._4_4_ = 0; p._4_4_ < _ret->count_protocols; p._4_4_ = p._4_4_ + 1) {
      pt->fake_wsi->protocol = local_40;
      if (local_40->callback != (lws_callback_function *)0x0) {
        iVar1 = (*local_40->callback)(pt->fake_wsi,reason,(void *)0x0,in,len);
        if (iVar1 != 0) {
          p._0_4_ = 1;
        }
      }
      local_40 = local_40 + 1;
    }
  }
  return (int)p;
}

Assistant:

int
lws_broadcast(struct lws_context_per_thread *pt, int reason, void *in, size_t len)
{
	struct lws_vhost *v = pt->context->vhost_list;
	int n, ret = 0;

	pt->fake_wsi->context = pt->context;

	while (v) {
		const struct lws_protocols *p = v->protocols;
		pt->fake_wsi->vhost = v; /* not a real bound wsi */

		for (n = 0; n < v->count_protocols; n++) {
			pt->fake_wsi->protocol = p;
			if (p->callback &&
			    p->callback(pt->fake_wsi, reason, NULL, in, len))
				ret |= 1;
			p++;
		}
		v = v->vhost_next;
	}

	return ret;
}